

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O2

void __thiscall jbcoin::STAmount::STAmount(STAmount *this,SField *name,int64_t mantissa)

{
  mantissa_type mVar1;
  
  (this->super_STBase).fName = name;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002f8010;
  (this->mIssue).currency.pn[0] = 0;
  (this->mIssue).currency.pn[1] = 0;
  (this->mIssue).currency.pn[2] = 0;
  (this->mIssue).currency.pn[3] = 0;
  *(undefined8 *)((this->mIssue).currency.pn + 4) = 0;
  (this->mIssue).account.pn[1] = 0;
  (this->mIssue).account.pn[2] = 0;
  (this->mIssue).account.pn[3] = 0;
  (this->mIssue).account.pn[4] = 0;
  this->mOffset = 0;
  this->mIsNative = true;
  mVar1 = -mantissa;
  if (0 < mantissa) {
    mVar1 = mantissa;
  }
  this->mIsNegative = SUB81((ulong)mantissa >> 0x3f,0);
  this->mValue = mVar1;
  return;
}

Assistant:

STBase::STBase (SField const& n)
    : fName(&n)
{
    assert(fName);
}